

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O1

void __thiscall
amrex::PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::AllocateBuffer
          (PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *this,size_type a_capacity)

{
  XDim3 *__dest;
  
  __dest = __gnu_cxx::new_allocator<amrex::XDim3>::allocate
                     ((new_allocator<amrex::XDim3> *)this,a_capacity,(void *)0x0);
  if (this->m_data != (pointer)0x0) {
    memcpy(__dest,this->m_data,this->m_size * 0x18);
    Gpu::Device::streamSynchronize();
  }
  operator_delete(this->m_data,this->m_capacity * 0x18);
  this->m_data = __dest;
  this->m_capacity = a_capacity;
  return;
}

Assistant:

void AllocateBuffer (size_type a_capacity) noexcept
        {
            pointer new_data = allocate(a_capacity);
            if (m_data) {
                detail::memCopyImpl<Allocator>(new_data, m_data, size() * sizeof(T), *this);
                amrex::Gpu::streamSynchronize();
            }
            deallocate(m_data, capacity());
            m_data = new_data;
            m_capacity = a_capacity;
        }